

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O1

void Js::CacheOperators::TraceCacheCommon
               (char16 *methodName,PropertyId propertyId,ScriptContext *requestContext,
               RecyclableObject *object)

{
  BOOL BVar1;
  ULONG UVar2;
  ULONG UVar3;
  FunctionBody *this;
  PropertyRecord *pPVar4;
  JavascriptFunction *local_48;
  JavascriptFunction *caller;
  char16 *local_38;
  
  if (object != (RecyclableObject *)0x0) {
    caller = (JavascriptFunction *)methodName;
    BVar1 = JavascriptStackWalker::GetCaller(&local_48,requestContext);
    if (BVar1 == 0) {
      UVar2 = 0;
      UVar3 = 0;
      local_38 = (char16 *)0x0;
    }
    else {
      this = JavascriptFunction::GetFunctionBody(local_48);
      local_38 = ParseableFunctionInfo::GetExternalDisplayName(&this->super_ParseableFunctionInfo);
      UVar2 = ParseableFunctionInfo::GetLineNumber(&this->super_ParseableFunctionInfo);
      UVar3 = ParseableFunctionInfo::GetColumnNumber(&this->super_ParseableFunctionInfo);
    }
    pPVar4 = ScriptContext::GetPropertyName(requestContext,propertyId);
    Output::Print(L"%s, %s, %s(%d:%d), InType: 0x%X ",caller,pPVar4 + 1,local_38,(ulong)UVar2,
                  (ulong)UVar3,(object->type).ptr);
  }
  return;
}

Assistant:

void CacheOperators::TraceCacheCommon(const char16 * methodName, PropertyId propertyId, ScriptContext * requestContext, RecyclableObject * object)
    {
        if(object)
        {
            JavascriptFunction* caller;
            const WCHAR* callerName = NULL;
            uint lineNumber = 0;
            uint columnNumber = 0;
            if(JavascriptStackWalker::GetCaller(&caller, requestContext))
            {
                FunctionBody *functionBody = caller->GetFunctionBody();
                callerName = functionBody->GetExternalDisplayName();
                lineNumber = functionBody->GetLineNumber();
                columnNumber = functionBody->GetColumnNumber();
            }
            Output::Print(_u("%s, %s, %s(%d:%d), InType: 0x%X "),
                methodName,
                requestContext->GetPropertyName(propertyId)->GetBuffer(),
                callerName,
                lineNumber,
                columnNumber,
                object->GetType());
        }
    }